

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamHeaderValidator_p.cpp
# Opt level: O2

bool __thiscall BamTools::Internal::SamHeaderValidator::ValidateGroupOrder(SamHeaderValidator *this)

{
  __type _Var1;
  bool bVar2;
  string *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  bVar2 = true;
  if ((this->m_header->GroupOrder)._M_string_length != 0) {
    __lhs = &this->m_header->GroupOrder;
    _Var1 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)Constants::SAM_HD_GROUPORDER_NONE_abi_cxx11_);
    if (!_Var1) {
      _Var1 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)Constants::SAM_HD_GROUPORDER_QUERY_abi_cxx11_);
      if (!_Var1) {
        _Var1 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)Constants::SAM_HD_GROUPORDER_REFERENCE_abi_cxx11_);
        if (!_Var1) {
          std::operator+(&bStack_38,"Invalid group order (GO): ",__lhs);
          AddError(this,&bStack_38);
          std::__cxx11::string::~string((string *)&bStack_38);
          bVar2 = false;
        }
      }
    }
  }
  return bVar2;
}

Assistant:

bool SamHeaderValidator::ValidateGroupOrder(void) {

    const string& groupOrder = m_header.GroupOrder;

    // if no group order, no problem, just return OK
    if ( groupOrder.empty() )
        return true;

    // if group order is valid keyword
    if ( groupOrder == Constants::SAM_HD_GROUPORDER_NONE  ||
         groupOrder == Constants::SAM_HD_GROUPORDER_QUERY ||
         groupOrder == Constants::SAM_HD_GROUPORDER_REFERENCE
       )
    {
        return true;
    }

    // otherwise
    AddError("Invalid group order (GO): " + groupOrder);
    return false;
}